

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtration_algorithms.h
# Opt level: O0

filtration_algorithm_t * get_filtration_computer(string *algorithm)

{
  bool bVar1;
  filtration_algorithm_t *pfVar2;
  invalid_argument *this;
  string *in_RDI;
  string err_msg;
  filtration_algorithm_t *custom;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  string local_a8 [24];
  undefined8 in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff88;
  string local_58 [32];
  filtration_algorithm_t *local_38;
  char *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  filtration_algorithm_t *local_8;
  
  local_18 = std::__cxx11::string::begin();
  local_20 = std::__cxx11::string::end();
  local_28 = std::__cxx11::string::begin();
  local_30 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                in_stack_ffffffffffffff38,(_func_int_int *)in_stack_ffffffffffffff30
                               );
  bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28), bVar1)) {
    local_8 = (filtration_algorithm_t *)0x0;
  }
  else {
    std::__cxx11::string::string(local_58,in_RDI);
    pfVar2 = get_custom_filtration_computer(in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_58);
    local_8 = pfVar2;
    if (pfVar2 == (filtration_algorithm_t *)0x0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
      local_38 = pfVar2;
      std::operator+(in_stack_ffffffffffffff78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff70);
      std::operator+(__lhs,(char *)in_stack_ffffffffffffff30);
      std::__cxx11::string::~string(local_a8);
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,(string *)&stack0xffffffffffffff78);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return local_8;
}

Assistant:

filtration_algorithm_t* get_filtration_computer(std::string algorithm) {
	std::transform(algorithm.begin(), algorithm.end(), algorithm.begin(), ::tolower);

	// For the trivial filtration, skip the computation of filtration values altogether
	if (algorithm == "zero" || algorithm == "") return nullptr;

	filtration_algorithm_t* custom = get_custom_filtration_computer(algorithm);

	if (custom != nullptr) return custom;

	std::string err_msg = "The filtration algorithm \"" + algorithm + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}